

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::RecursiveStructMemberIterator::RecursiveStructMemberIterator
          (RecursiveStructMemberIterator *this,ConstantValue *startVal,Type *startType)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  Type *pTVar3;
  
  (this->curr).valIndex = 0;
  (this->curr).fieldIt._M_current = (FieldSymbol **)0x0;
  (this->curr).fieldEnd._M_current = (FieldSymbol **)0x0;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.data_ =
       (pointer)(this->stack).
                super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.firstElement
  ;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.len = 0;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.cap = 4;
  (this->curr).val = startVal;
  (this->curr).type = startType;
  bVar2 = Type::isUnpackedStruct(startType);
  if (bVar2) {
    pTVar3 = Type::getCanonicalType((this->curr).type);
    pSVar1 = pTVar3[1].super_Symbol.originatingSyntax;
    pTVar3 = pTVar3[1].canonical;
    (this->curr).fieldIt._M_current = (FieldSymbol **)pSVar1;
    (this->curr).fieldEnd._M_current = (FieldSymbol **)(&pSVar1->kind + (long)pTVar3 * 2);
    prepNext(this);
  }
  return;
}

Assistant:

RecursiveStructMemberIterator(const ConstantValue& startVal, const Type& startType) {
        curr.val = &startVal;
        curr.type = &startType;

        if (curr.type->isUnpackedStruct()) {
            auto fields = curr.type->getCanonicalType().as<UnpackedStructType>().fields;
            curr.fieldIt = fields.begin();
            curr.fieldEnd = fields.end();
            prepNext();
        }
    }